

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGearConstraint.h
# Opt level: O1

char * __thiscall
btGearConstraint::serialize(btGearConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  int i;
  long lVar1;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  lVar1 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar1 * 4 + 0x40) = (this->m_axisInA).m_floats[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar1 * 4 + 0x50) = (this->m_axisInB).m_floats[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(btScalar *)((long)dataBuffer + 0x60) = this->m_ratio;
  return "btGearConstraintFloatData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btGearConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btGearConstraintData* gear = (btGearConstraintData*)dataBuffer;
	btTypedConstraint::serialize(&gear->m_typeConstraintData,serializer);

	m_axisInA.serialize( gear->m_axisInA );
	m_axisInB.serialize( gear->m_axisInB );

	gear->m_ratio = m_ratio;

	return btGearConstraintDataName;
}